

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

void nni_listener_bump_error(nni_listener *l,int err)

{
  int err_local;
  nni_listener *l_local;
  
  switch(err) {
  case 2:
    nni_stat_inc(&l->st_oom,1);
    break;
  default:
    nni_stat_inc(&l->st_other,1);
    break;
  case 5:
    nni_stat_inc(&l->st_timeout,1);
    break;
  case 0xd:
    nni_stat_inc(&l->st_proto,1);
    break;
  case 0x12:
  case 0x13:
    nni_stat_inc(&l->st_disconnect,1);
    break;
  case 0x14:
    nni_stat_inc(&l->st_canceled,1);
    break;
  case 0x1a:
  case 0x1b:
    nni_stat_inc(&l->st_auth,1);
  }
  return;
}

Assistant:

void
nni_listener_bump_error(nni_listener *l, int err)
{
#ifdef NNG_ENABLE_STATS
	switch (err) {
	case NNG_ECONNABORTED:
	case NNG_ECONNRESET:
		nni_stat_inc(&l->st_disconnect, 1);
		break;
	case NNG_ECANCELED:
		nni_stat_inc(&l->st_canceled, 1);
		break;
	case NNG_ETIMEDOUT:
		nni_stat_inc(&l->st_timeout, 1);
		break;
	case NNG_EPROTO:
		nni_stat_inc(&l->st_proto, 1);
		break;
	case NNG_EPEERAUTH:
	case NNG_ECRYPTO:
		nni_stat_inc(&l->st_auth, 1);
		break;
	case NNG_ENOMEM:
		nni_stat_inc(&l->st_oom, 1);
		break;
	default:
		nni_stat_inc(&l->st_other, 1);
		break;
	}
#else
	NNI_ARG_UNUSED(l);
	NNI_ARG_UNUSED(err);
#endif
}